

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLoadXYZROTnode::ChLoadXYZROTnode
          (ChLoadXYZROTnode *this,shared_ptr<chrono::fea::ChNodeFEAxyzrot> *body)

{
  element_type *peVar1;
  shared_ptr<chrono::ChLoadable> local_18;
  
  peVar1 = (body->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((long)&(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
         (long)(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-4]);
  }
  local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (body->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  ChLoadCustom::ChLoadCustom(&this->super_ChLoadCustom,&local_18);
  if (local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustom_00b52c98;
  (this->computed_abs_force).m_data[0] = 0.0;
  (this->computed_abs_force).m_data[1] = 0.0;
  (this->computed_abs_force).m_data[2] = 0.0;
  (this->computed_abs_torque).m_data[0] = 0.0;
  (this->computed_abs_force).m_data[2] = 0.0;
  (this->computed_abs_torque).m_data[0] = 0.0;
  (this->computed_abs_torque).m_data[1] = 0.0;
  (this->computed_abs_torque).m_data[2] = 0.0;
  if (this != (ChLoadXYZROTnode *)&DAT_00b90a58) {
    (this->computed_abs_force).m_data[0] = VNULL;
    (this->computed_abs_force).m_data[1] = DAT_00b90ac0;
    (this->computed_abs_force).m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChLoadXYZROTnode *)(Q_ROTATE_Z_TO_X + 0x10)) {
    (this->computed_abs_torque).m_data[0] = VNULL;
    (this->computed_abs_torque).m_data[1] = DAT_00b90ac0;
    (this->computed_abs_torque).m_data[2] = DAT_00b90ac8;
  }
  return;
}

Assistant:

ChLoadXYZROTnode::ChLoadXYZROTnode(std::shared_ptr<ChNodeFEAxyzrot> body) : ChLoadCustom(body) {
    computed_abs_force = VNULL;
    computed_abs_torque = VNULL;
}